

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idna.c
# Opt level: O0

int32_t uv__wtf8_decode1(char **input)

{
  byte bVar1;
  byte bVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint8_t b4;
  uint8_t b3;
  uint8_t b2;
  uint8_t b1;
  uint32_t code_point;
  char **input_local;
  
  bVar1 = **input;
  if (bVar1 < 0x80) {
    input_local._4_4_ = (uint)bVar1;
  }
  else if (bVar1 < 0xc2) {
    input_local._4_4_ = 0xffffffff;
  }
  else {
    pcVar3 = *input;
    *input = pcVar3 + 1;
    bVar2 = pcVar3[1];
    if ((bVar2 & 0xc0) == 0x80) {
      uVar4 = (uint)bVar1 << 6;
      uVar5 = bVar2 & 0x3f;
      if (bVar1 < 0xe0) {
        input_local._4_4_ = uVar4 & 0x7ff | uVar5;
      }
      else {
        pcVar3 = *input;
        *input = pcVar3 + 1;
        bVar2 = pcVar3[1];
        if ((bVar2 & 0xc0) == 0x80) {
          uVar6 = bVar2 & 0x3f;
          if (bVar1 < 0xf0) {
            input_local._4_4_ = (uVar4 & 0x3ff | uVar5) << 6 | uVar6;
          }
          else {
            pcVar3 = *input;
            *input = pcVar3 + 1;
            bVar2 = pcVar3[1];
            if ((bVar2 & 0xc0) == 0x80) {
              if ((0xf4 < bVar1) ||
                 (input_local._4_4_ = ((uVar4 & 0x1ff | uVar5) << 6 | uVar6) << 6 | bVar2 & 0x3f,
                 0x10ffff < input_local._4_4_)) {
                input_local._4_4_ = 0xffffffff;
              }
            }
            else {
              input_local._4_4_ = 0xffffffff;
            }
          }
        }
        else {
          input_local._4_4_ = 0xffffffff;
        }
      }
    }
    else {
      input_local._4_4_ = 0xffffffff;
    }
  }
  return input_local._4_4_;
}

Assistant:

static int32_t uv__wtf8_decode1(const char** input) {
  uint32_t code_point;
  uint8_t b1;
  uint8_t b2;
  uint8_t b3;
  uint8_t b4;

  b1 = **input;
  if (b1 <= 0x7F)
    return b1; /* ASCII code point */
  if (b1 < 0xC2)
    return -1; /* invalid: continuation byte */
  code_point = b1;

  b2 = *++*input;
  if ((b2 & 0xC0) != 0x80)
    return -1; /* invalid: not a continuation byte */
  code_point = (code_point << 6) | (b2 & 0x3F);
  if (b1 <= 0xDF)
    return 0x7FF & code_point; /* two-byte character */

  b3 = *++*input;
  if ((b3 & 0xC0) != 0x80)
    return -1; /* invalid: not a continuation byte */
  code_point = (code_point << 6) | (b3 & 0x3F);
  if (b1 <= 0xEF)
    return 0xFFFF & code_point; /* three-byte character */

  b4 = *++*input;
  if ((b4 & 0xC0) != 0x80)
    return -1; /* invalid: not a continuation byte */
  code_point = (code_point << 6) | (b4 & 0x3F);
  if (b1 <= 0xF4) {
    code_point &= 0x1FFFFF;
    if (code_point <= 0x10FFFF)
      return code_point; /* four-byte character */
  }

  /* code point too large */
  return -1;
}